

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexicalAnalyzer.cpp
# Opt level: O0

void __thiscall LexicalAnalyzer::endVariable(LexicalAnalyzer *this,string *str)

{
  bool bVar1;
  __type _Var2;
  reference pbVar3;
  char *pcVar4;
  __type local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [32];
  string local_50 [8];
  string temp;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_30;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string *str_local;
  LexicalAnalyzer *this_local;
  
  do {
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->vStrSignsNotFirst);
    local_30._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->vStrSignsNotFirst);
    while (bVar1 = __gnu_cxx::operator!=(&__end2,&local_30), bVar1) {
      pbVar3 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end2);
      std::__cxx11::string::string(local_50,(string *)pbVar3);
      std::__cxx11::string::substr((ulong)local_70,(ulong)str);
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_50,local_70);
      local_b9 = true;
      if (!_Var2) {
        std::__cxx11::string::substr((ulong)local_a0,(ulong)str);
        local_b9 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_50,local_a0);
        std::__cxx11::string::~string((string *)local_a0);
      }
      std::__cxx11::string::~string((string *)local_70);
      std::__cxx11::string::~string(local_50);
      if (local_b9 != false) {
        return;
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)str);
    std::__cxx11::string::operator+=((string *)&this->variable,*pcVar4);
    this->index = this->index + 1;
  } while( true );
}

Assistant:

void LexicalAnalyzer::endVariable(string str){
    while(true){
        for(string temp : vStrSignsNotFirst){
            if((temp == str.substr(index,2) || (temp == str.substr(index,1))))
                return;
        }
        variable += str[index];
        index++;
    }
}